

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::InitializeNode
          (PeerManagerImpl *this,CNode *node,ServiceFlags our_services)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  NetPermissionFlags NVar3;
  ConnectionType CVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  _Rb_tree_node_base *p_Var8;
  size_t sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar11;
  _Base_ptr p_Var12;
  const_iterator __position;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr *pp_Var14;
  _Link_type __p;
  _func_int **peer_00;
  iterator __pos;
  _Base_ptr p_Var15;
  ServiceFlags SVar16;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar17;
  PeerRef peer;
  NodeId nodeid;
  __allocator_type __a2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  peer_00 = (_func_int **)node->id;
  nodeid = (NodeId)peer_00;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock25,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x6b7,false);
  p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  pVar17 = std::
           _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
           ::_M_get_insert_hint_unique_pos
                     (&(this->m_node_states)._M_t,(const_iterator)p_Var1,&nodeid);
  __position._M_node = pVar17.second;
  if (__position._M_node != (_Base_ptr)0x0) {
    p_Var8 = (_Rb_tree_node_base *)operator_new(0xb8);
    *(_func_int ***)(p_Var8 + 1) = peer_00;
    memset(&p_Var8[1]._M_parent,0,0x88);
    p_Var8[3]._M_right = (_Base_ptr)&p_Var8[3]._M_left;
    p_Var8[3]._M_left = (_Base_ptr)&p_Var8[3]._M_left;
    *(undefined2 *)&p_Var8[5]._M_parent = 0;
    p_Var8[4]._M_right = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var8 + 5) = 0;
    p_Var8[5]._M_left = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var8 + 4) = 0;
    p_Var8[4]._M_parent = (_Base_ptr)0x0;
    *(undefined4 *)((long)&p_Var8[4]._M_parent + 7) = 0;
    pVar17 = std::
             _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
             ::_M_get_insert_hint_unique_pos
                       (&(this->m_node_states)._M_t,__position,(key_type_conflict *)(p_Var8 + 1));
    p_Var13 = pVar17.second;
    if (p_Var13 == (_Rb_tree_node_base *)0x0) {
      std::
      _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
      ::_M_drop_node((_Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
                      *)p_Var8,(_Link_type)__position._M_node);
    }
    else {
      bVar7 = true;
      if (p_Var1 != (_Rb_tree_header *)p_Var13 && pVar17.first == (_Rb_tree_node_base *)0x0) {
        bVar7 = (long)peer_00 < *(long *)(p_Var13 + 1);
      }
      std::_Rb_tree_insert_and_rebalance
                (bVar7,p_Var8,(_Rb_tree_node_base *)p_Var13,(_Rb_tree_node_base *)p_Var1);
      psVar2 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *psVar2 = *psVar2 + 1;
      peer_00 = (_func_int **)nodeid;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock25.super_unique_lock);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&criticalblock25,&this->m_tx_download_mutex,
             "m_tx_download_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x6bb,false);
  sVar9 = TxRequestTracker::Count(&this->m_txrequest,(NodeId)peer_00);
  if (sVar9 != 0) {
    __assert_fail("m_txrequest.Count(nodeid) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6bc,
                  "virtual void (anonymous namespace)::PeerManagerImpl::InitializeNode(const CNode &, ServiceFlags)"
                 );
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock25);
  NVar3 = node->m_permission_flags;
  CVar4 = node->m_conn_type;
  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x298);
  criticalblock25.super_unique_lock._M_device = (mutex_type *)&__a2;
  *(bool *)&p_Var10[2]._M_use_count = CVar4 == INBOUND;
  p_Var10->_M_use_count = 1;
  p_Var10->_M_weak_count = 1;
  p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00a12f30;
  SVar16 = NVar3 * 2 & 4 | our_services;
  p_Var10[1]._vptr__Sp_counted_base = peer_00;
  p_Var10[1]._M_use_count = (int)SVar16;
  p_Var10[1]._M_weak_count = (int)(SVar16 >> 0x20);
  p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined8 *)((long)&p_Var10[4]._M_use_count + 1) = 0;
  *(undefined8 *)((long)&p_Var10[5]._vptr__Sp_counted_base + 1) = 0;
  p_Var10[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[4]._M_use_count = 0;
  p_Var10[4]._M_weak_count = 0;
  p_Var10[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[3]._M_use_count = 0;
  p_Var10[3]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var10[0xc]._M_use_count + 1) = 0;
  *(undefined8 *)((long)&p_Var10[0xd]._vptr__Sp_counted_base + 1) = 0;
  p_Var10[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0xc]._M_use_count = 0;
  p_Var10[0xc]._M_weak_count = 0;
  p_Var10[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0xb]._M_use_count = 0;
  p_Var10[0xb]._M_weak_count = 0;
  p_Var10[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[10]._M_use_count = 0;
  p_Var10[10]._M_weak_count = 0;
  p_Var10[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[9]._M_use_count = 0;
  p_Var10[9]._M_weak_count = 0;
  p_Var10[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[8]._M_use_count = 0;
  p_Var10[8]._M_weak_count = 0;
  p_Var10[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[7]._M_use_count = 0;
  p_Var10[7]._M_weak_count = 0;
  p_Var10[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[6]._M_use_count = 0;
  p_Var10[6]._M_weak_count = 0;
  p_Var10[0xd]._M_weak_count = -1;
  p_Var10[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0xe]._M_use_count = 0;
  p_Var10[0xe]._M_weak_count = 0;
  *(undefined2 *)&p_Var10[0xf]._vptr__Sp_counted_base = 0;
  p_Var10[0xf]._M_use_count = 0;
  p_Var10[0xf]._M_weak_count = 0;
  p_Var10[0x10]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined2 *)&p_Var10[0x12]._M_use_count = 0;
  p_Var10[0x10]._M_use_count = 0;
  p_Var10[0x10]._M_weak_count = 0;
  p_Var10[0x11]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x11]._M_use_count = 0;
  p_Var10[0x11]._M_weak_count = 0;
  p_Var10[0x12]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x13]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x13]._M_use_count = 0;
  p_Var10[0x13]._M_weak_count = 0;
  p_Var10[0x14]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x14]._M_use_count = 0;
  p_Var10[0x14]._M_weak_count = 0;
  p_Var10[0x15]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x15]._M_use_count = 0;
  p_Var10[0x15]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var10[0x15]._M_use_count + 2) = 0;
  *(undefined8 *)((long)&p_Var10[0x16]._vptr__Sp_counted_base + 2) = 0;
  p_Var10[0x17]._vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  criticalblock25.super_unique_lock._8_8_ = p_Var10;
  tVar11 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                     ();
  *(duration *)&p_Var10[0x17]._M_use_count = tVar11.__d.__r;
  p_Var10[0x19]._M_use_count = 0;
  p_Var10[0x19]._M_weak_count = 0;
  p_Var10[0x1a]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x1b]._M_use_count = 0;
  p_Var10[0x1b]._M_weak_count = 0;
  p_Var10[0x1a]._M_use_count = 0;
  p_Var10[0x1a]._M_weak_count = 0;
  p_Var10[0x1b]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x18]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x18]._M_use_count = 0;
  p_Var10[0x18]._M_weak_count = 0;
  *(undefined1 *)&p_Var10[0x19]._vptr__Sp_counted_base = 0;
  std::_Deque_base<CInv,_std::allocator<CInv>_>::_Deque_base
            ((_Deque_base<CInv,_std::allocator<CInv>_> *)(p_Var10 + 0x1c));
  p_Var10[0x25]._vptr__Sp_counted_base = (_func_int **)0x0;
  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var10 + 1);
  *(undefined1 *)&p_Var10[0x25]._M_use_count = 0;
  p_Var10[0x21]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x21]._M_use_count = 0;
  p_Var10[0x21]._M_weak_count = 0;
  p_Var10[0x22]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x22]._M_use_count = 0;
  p_Var10[0x22]._M_weak_count = 0;
  p_Var10[0x23]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x23]._M_use_count = 0;
  p_Var10[0x23]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var10[0x23]._M_use_count + 1) = 0;
  *(undefined8 *)((long)&p_Var10[0x24]._vptr__Sp_counted_base + 1) = 0;
  p_Var10[0x26]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x26]._M_use_count = 0;
  p_Var10[0x26]._M_weak_count = 0;
  p_Var10[0x29]._vptr__Sp_counted_base = (_func_int **)0x0;
  criticalblock25.super_unique_lock._M_owns = false;
  criticalblock25.super_unique_lock._9_7_ = 0;
  p_Var10[0x27]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x27]._M_use_count = 0;
  p_Var10[0x27]._M_weak_count = 0;
  p_Var10[0x28]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x28]._M_use_count = 0;
  p_Var10[0x28]._M_weak_count = 0;
  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var10;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::Peer,_std::allocator<(anonymous_namespace)::Peer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::Peer,_std::allocator<(anonymous_namespace)::Peer>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&criticalblock25);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&criticalblock25,&this->m_peer_mutex,
             "m_peer_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0x6c5,false);
  p_Var8 = (_Rb_tree_node_base *)operator_new(0x38);
  p_Var1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
  *(_func_int ***)(p_Var8 + 1) = peer_00;
  __p = (_Link_type)&peer;
  std::shared_ptr<(anonymous_namespace)::Peer>::shared_ptr
            ((shared_ptr<(anonymous_namespace)::Peer> *)&p_Var8[1]._M_parent,
             (shared_ptr<(anonymous_namespace)::Peer> *)__p);
  lVar6 = *(long *)(p_Var8 + 1);
  if (((this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (p_Var15 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
     lVar6 <= *(long *)(p_Var15 + 1))) {
    bVar7 = true;
    pp_Var14 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var15 = &p_Var1->_M_header;
    while (p_Var12 = *pp_Var14, p_Var12 != (_Base_ptr)0x0) {
      bVar7 = lVar6 < *(long *)(p_Var12 + 1);
      p_Var15 = p_Var12;
      pp_Var14 = &p_Var12->_M_left + (*(long *)(p_Var12 + 1) <= lVar6);
    }
    p_Var12 = p_Var15;
    if (bVar7) {
      if (p_Var15 == (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      goto LAB_001a7989;
      p_Var12 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var15);
    }
    if (lVar6 <= *(long *)(p_Var12 + 1)) {
      std::
      _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
      ::_M_drop_node((_Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
                      *)p_Var8,__p);
      goto LAB_001a79bb;
    }
  }
LAB_001a7989:
  if (p_Var1 == (_Rb_tree_header *)p_Var15) {
    bVar7 = true;
  }
  else {
    bVar7 = lVar6 < *(long *)(p_Var15 + 1);
  }
  std::_Rb_tree_insert_and_rebalance
            (bVar7,p_Var8,(_Rb_tree_node_base *)p_Var15,(_Rb_tree_node_base *)p_Var1);
  psVar2 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
LAB_001a79bb:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock25);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::InitializeNode(const CNode& node, ServiceFlags our_services)
{
    NodeId nodeid = node.GetId();
    {
        LOCK(cs_main); // For m_node_states
        m_node_states.try_emplace(m_node_states.end(), nodeid);
    }
    {
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Count(nodeid) == 0);
    }

    if (NetPermissions::HasFlag(node.m_permission_flags, NetPermissionFlags::BloomFilter)) {
        our_services = static_cast<ServiceFlags>(our_services | NODE_BLOOM);
    }

    PeerRef peer = std::make_shared<Peer>(nodeid, our_services, node.IsInboundConn());
    {
        LOCK(m_peer_mutex);
        m_peer_map.emplace_hint(m_peer_map.end(), nodeid, peer);
    }
}